

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hxx
# Opt level: O2

void lineage::validate(ProblemGraph *problemGraph,Solution *solution)

{
  Graph *graph;
  size_t sVar1;
  Problem *pPVar2;
  pointer pvVar3;
  long lVar4;
  pointer pEVar5;
  Value VVar6;
  Value VVar7;
  size_t vs;
  size_t vt;
  bool bVar8;
  bool bVar9;
  ostream *poVar10;
  pointer pRVar11;
  ulong uVar12;
  size_t j;
  ulong uVar13;
  pointer pAVar14;
  char *pcVar15;
  size_t j_1;
  ComponentLabeling componentsPerFrame;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> descendantComponents;
  SubgraphCutTwoFrames subgraph;
  ComponentLabeling components;
  SubgraphWithoutCut subgraphCut;
  SubgraphCutPerFrame subgraphCutPerFrame;
  
  pPVar2 = problemGraph->problem_;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  components.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  graph = &problemGraph->graph_;
  subgraphCut.edgeLabels_ = &solution->edge_labels;
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut>
            ((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
              *)&components,graph,&subgraphCut);
  componentsPerFrame.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  componentsPerFrame.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  componentsPerFrame.labels_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subgraphCutPerFrame.problem_ = pPVar2;
  subgraphCutPerFrame.edgeLabels_ = &solution->edge_labels;
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
              *)&componentsPerFrame,graph,&subgraphCutPerFrame);
  poVar10 = std::operator<<((ostream *)&std::cerr,"overall: ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," nodes, ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," edges");
  std::endl<char,std::char_traits<char>>(poVar10);
  uVar12 = 0;
  do {
    if (problemGraph->numberOfFrames_ <= uVar12) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&componentsPerFrame)
      ;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&components);
      return;
    }
    poVar10 = std::operator<<((ostream *)&std::cerr,"frame ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10,": ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," nodes, ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," edges");
    std::endl<char,std::char_traits<char>>(poVar10);
    if (uVar12 != 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"   ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," inter-frame edges with frame ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    if (uVar12 != problemGraph->numberOfFrames_ - 1) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"   ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," inter-frame edges with frame ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    bVar8 = true;
    for (uVar13 = 0;
        pvVar3 = (problemGraph->edgeIndicesInFrame_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar4 = *(long *)&pvVar3[uVar12].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data,
        uVar13 < (ulong)((long)*(pointer *)
                                ((long)&pvVar3[uVar12].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3);
        uVar13 = uVar13 + 1) {
      lVar4 = *(long *)(lVar4 + uVar13 * 8);
      pEVar5 = (problemGraph->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      VVar6 = pEVar5[lVar4].vertexIndices_[0];
      VVar7 = pEVar5[lVar4].vertexIndices_[1];
      if ((componentsPerFrame.labels_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[VVar6] !=
          componentsPerFrame.labels_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[VVar7]) ==
          ((solution->edge_labels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar4] == '\0')) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"   error: the intra-frame edge ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," between nodes ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," (t=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             (problemGraph->problem_->nodes).
                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                             _M_impl.super__Vector_impl_data._M_start[VVar6].t);
        poVar10 = std::operator<<(poVar10,", cx=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(int *)((long)((problemGraph->problem_->nodes).
                                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                             ._M_impl.super__Vector_impl_data._M_start + VVar6) + 8)
                            );
        poVar10 = std::operator<<(poVar10,", cy=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(int *)((long)((problemGraph->problem_->nodes).
                                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                             ._M_impl.super__Vector_impl_data._M_start + VVar6) +
                                     0xc));
        poVar10 = std::operator<<(poVar10,", frame component=");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,") and ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," (t=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             (problemGraph->problem_->nodes).
                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                             _M_impl.super__Vector_impl_data._M_start[VVar7].t);
        poVar10 = std::operator<<(poVar10,", cx=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(int *)((long)((problemGraph->problem_->nodes).
                                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                             ._M_impl.super__Vector_impl_data._M_start + VVar7) + 8)
                            );
        poVar10 = std::operator<<(poVar10,", cy=");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(int *)((long)((problemGraph->problem_->nodes).
                                             super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                             ._M_impl.super__Vector_impl_data._M_start + VVar7) +
                                     0xc));
        poVar10 = std::operator<<(poVar10,", frame component=");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,") is part of a violated cycle constraint.");
        std::endl<char,std::char_traits<char>>(poVar10);
        bVar8 = false;
      }
    }
    if (bVar8) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "   the intra-frame edges labeled 1 well-define a multicut");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    if (uVar12 < problemGraph->numberOfFrames_ - 1) {
      for (uVar13 = 0;
          pvVar3 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar4 = *(long *)&pvVar3[uVar12].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data,
          uVar13 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar3[uVar12].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3);
          uVar13 = uVar13 + 1) {
        lVar4 = *(long *)(lVar4 + uVar13 * 8);
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pRVar11 = (graph->vertices_).
                  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (pAVar14 = *(pointer *)
                        &pRVar11[lVar4].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
            ; pAVar14 !=
              *(pointer *)
               ((long)&pRVar11[lVar4].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               + 8); pAVar14 = pAVar14 + 1) {
          if ((uVar12 + 1 ==
               (long)(pPVar2->nodes).
                     super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                     super__Vector_impl_data._M_start[pAVar14->vertex_].t) &&
             ((solution->edge_labels).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[pAVar14->edge_] == '\0')) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&descendantComponents,
                       componentsPerFrame.labels_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + pAVar14->vertex_);
            pRVar11 = (graph->vertices_).
                      super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        if (descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10," (t=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               (problemGraph->problem_->nodes).
                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar4].t);
          poVar10 = std::operator<<(poVar10,", cx=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       8));
          poVar10 = std::operator<<(poVar10,", cy=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       0xc));
          poVar10 = std::operator<<(poVar10,", frame component=");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          pcVar15 = ") has *no* descendant in frame ";
LAB_0011f27b:
          poVar10 = std::operator<<(poVar10,pcVar15);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        else if (descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10," (t=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       8));
          poVar10 = std::operator<<(poVar10,", cx=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       8));
          poVar10 = std::operator<<(poVar10,", cy=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       0xc));
          poVar10 = std::operator<<(poVar10,", frame component=");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,") has ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          pcVar15 = " descendants in frame ";
          goto LAB_0011f27b;
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&descendantComponents._M_t);
      }
    }
    if (uVar12 != 0) {
      sVar1 = uVar12 - 1;
      bVar8 = true;
      for (uVar13 = 0;
          pvVar3 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar4 = *(long *)&pvVar3[uVar12].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data,
          uVar13 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar3[uVar12].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3);
          uVar13 = uVar13 + 1) {
        lVar4 = *(long *)(lVar4 + uVar13 * 8);
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pRVar11 = (graph->vertices_).
                  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             descendantComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (pAVar14 = *(pointer *)
                        &pRVar11[lVar4].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
            ; pAVar14 !=
              *(pointer *)
               ((long)&pRVar11[lVar4].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               + 8); pAVar14 = pAVar14 + 1) {
          if (((sVar1 == (long)(pPVar2->nodes).
                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                               _M_impl.super__Vector_impl_data._M_start[pAVar14->vertex_].t) &&
              ((solution->edge_labels).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[pAVar14->edge_] == '\0')) &&
             (std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&descendantComponents,
                         componentsPerFrame.labels_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + pAVar14->vertex_),
             1 < descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
            poVar10 = std::operator<<((ostream *)&std::cerr,"   error: morality violated at node ");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10," (t=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 (problemGraph->problem_->nodes).
                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar4].t);
            poVar10 = std::operator<<(poVar10,", cx=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar4)
                                         + 8));
            poVar10 = std::operator<<(poVar10,", cy=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar4)
                                         + 0xc));
            poVar10 = std::operator<<(poVar10,", frame component=");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10,")");
            std::endl<char,std::char_traits<char>>(poVar10);
            bVar8 = false;
          }
          pRVar11 = (graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        if (descendantComponents._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10," (t=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               (problemGraph->problem_->nodes).
                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar4].t);
          poVar10 = std::operator<<(poVar10,", cx=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       8));
          poVar10 = std::operator<<(poVar10,", cy=");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(int *)((long)((problemGraph->problem_->nodes).
                                               super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar4) +
                                       0xc));
          poVar10 = std::operator<<(poVar10,", frame component=");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,") has no ancestor in frame ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&descendantComponents._M_t);
      }
      if (bVar8) {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "   labeling of incoming inter-frame edges is moral");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      bVar8 = true;
      uVar13 = 0;
      subgraph.problem_ = pPVar2;
      subgraph.edgeLabels_ = &solution->edge_labels;
      subgraph.firstFrame_ = sVar1;
      for (; pvVar3 = (problemGraph->edgeIndicesFromFrame_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          lVar4 = *(long *)&pvVar3[sVar1].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data,
          uVar13 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar3[sVar1].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3);
          uVar13 = uVar13 + 1) {
        lVar4 = *(long *)(lVar4 + uVar13 * 8);
        if ((solution->edge_labels).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] == '\x01') {
          pEVar5 = (problemGraph->graph_).edges_.
                   super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          vs = pEVar5[lVar4].vertexIndices_[0];
          vt = pEVar5[lVar4].vertexIndices_[1];
          std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_Deque_base
                    ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &descendantComponents);
          bVar9 = andres::graph::
                  spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (graph,&subgraph,vs,vt,
                             (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &descendantComponents);
          if (bVar9) {
            poVar10 = std::operator<<((ostream *)&std::cerr,"   error: the inter-frame edge ");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10," between nodes ");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10," (t=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 (problemGraph->problem_->nodes).
                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                 _M_impl.super__Vector_impl_data._M_start[vs].t);
            poVar10 = std::operator<<(poVar10,", cx=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + vs) + 8
                                         ));
            poVar10 = std::operator<<(poVar10,", cy=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + vs) +
                                         0xc));
            poVar10 = std::operator<<(poVar10,", frame component=");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10,") and ");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10," (t=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 (problemGraph->problem_->nodes).
                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                 _M_impl.super__Vector_impl_data._M_start[vt].t);
            poVar10 = std::operator<<(poVar10,", cx=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + vt) + 8
                                         ));
            poVar10 = std::operator<<(poVar10,", cy=");
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(int *)((long)((problemGraph->problem_->nodes).
                                                 super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + vt) +
                                         0xc));
            poVar10 = std::operator<<(poVar10,", frame component=");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            poVar10 = std::operator<<(poVar10,
                                      ") is part of a violated inter-frame cycle constraint.");
            std::endl<char,std::char_traits<char>>(poVar10);
            bVar8 = false;
          }
          std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                    ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &descendantComponents);
        }
      }
      if (bVar8) {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "   labeling of incoming inter-frame edges satisfies cycle constraints"
                                 );
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

inline
void validate(ProblemGraph const& problemGraph, Solution const& solution)
{
    struct SubgraphWithoutCut
    {
        SubgraphWithoutCut(lineage::Solution::EdgeLabels const& edgeLabels) :
            edgeLabels_(edgeLabels)
        {}
        
        bool vertex(size_t i) const
        { 
            return true;
        }
        
        bool edge(size_t i) const
        {
            return edgeLabels_[i] == 0;
        }

        lineage::Solution::EdgeLabels const& edgeLabels_;
    };

    typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<lineage::Solution::EdgeLabels> SubgraphCutPerFrame;
    typedef ProblemGraph::SubgraphOfTwoFramesWithoutCut<lineage::Solution::EdgeLabels> SubgraphCutTwoFrames;
    typedef andres::graph::ComponentsBySearch<ProblemGraph::Graph> ComponentLabeling;

    Problem const& problem = problemGraph.problem();

    ComponentLabeling components;
    SubgraphWithoutCut subgraphCut(solution.edge_labels);
    components.build(problemGraph.graph(), subgraphCut);

    ComponentLabeling componentsPerFrame;
    SubgraphCutPerFrame subgraphCutPerFrame(problem, solution.edge_labels);
    componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

    // print numbers of nodes and edges
    std::cerr << "overall: " << problem.nodes.size()
        << " nodes, " << problem.edges.size()
        << " edges" << std::endl;

    for (size_t frame = 0; frame < problemGraph.numberOfFrames(); ++frame)
    {
        std::cerr << "frame " << frame
            << ": " << problemGraph.numberOfNodesInFrame(frame)
            << " nodes, " << problemGraph.numberOfEdgesInFrame(frame)
            << " edges" << std::endl;

        if (frame != 0)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame-1)
                << " inter-frame edges with frame " << frame - 1
                << std::endl;
        
        if (frame != problemGraph.numberOfFrames() - 1)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame)
                << " inter-frame edges with frame " << frame + 1
                << std::endl;

        // test whether edges labeled 1 well-define a multicut
        bool isMulticut = true;
        for (size_t j = 0; j < problemGraph.numberOfEdgesInFrame(frame); ++j)
        {
            auto e = problemGraph.edgeInFrame(frame, j);

            auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
            auto v1 = problemGraph.graph().vertexOfEdge(e, 1);

            if ((solution.edge_labels[e] == 0) != (componentsPerFrame.labels_[v0] == componentsPerFrame.labels_[v1]))
            {
                std::cerr << "   error: the intra-frame edge " << e
                    << " between nodes " << v0
                    << " (t=" << problemGraph.problem().nodes[v0].t
                    << ", cx=" << problemGraph.problem().nodes[v0].cx
                    << ", cy=" << problemGraph.problem().nodes[v0].cy
                    << ", frame component=" << componentsPerFrame.labels_[v0]
                    << ") and " << v1
                    << " (t=" << problemGraph.problem().nodes[v1].t
                    << ", cx=" << problemGraph.problem().nodes[v1].cx
                    << ", cy=" << problemGraph.problem().nodes[v1].cy
                    << ", frame component=" << componentsPerFrame.labels_[v1]
                    << ") is part of a violated cycle constraint."
                    << std::endl;

                isMulticut = false;
            }
        }

        if (isMulticut)
            std::cerr << "   the intra-frame edges labeled 1 well-define a multicut" << std::endl;

        // report splits and nodes without descendants
        if (frame < problemGraph.numberOfFrames() - 1)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> descendantComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();

                    if (problem.nodes[v1].t == frame + 1 && solution.edge_labels[e] == 0)
                        descendantComponents.insert(componentsPerFrame.labels_[v1]);
                }

                if (descendantComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has *no* descendant in frame " << frame + 1
                        << std::endl;
                else if (descendantComponents.size() > 1)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].cx
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has " << descendantComponents.size()
                        << " descendants in frame " << frame + 1
                        << std::endl;
            }

        // test morality and report nodes without ancestors
        bool isMoral = true;
        if (frame != 0)
        {
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> ancestorComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();
                    
                    if (problem.nodes[v1].t == frame - 1 && solution.edge_labels[e] == 0)
                    {
                        ancestorComponents.insert(componentsPerFrame.labels_[v1]);

                        if (ancestorComponents.size() > 1)
                        {
                            isMoral = false;

                            std::cerr << "   error: morality violated at node " << v0
                                << " (t=" << problemGraph.problem().nodes[v0].t
                                << ", cx=" << problemGraph.problem().nodes[v0].cx
                                << ", cy=" << problemGraph.problem().nodes[v0].cy
                                << ", frame component=" << componentsPerFrame.labels_[v0]
                                << ")" << std::endl;
                        }
                    }
                }

                if (ancestorComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has no ancestor in frame " << frame - 1
                        << std::endl;
            }
            
            if (isMoral)
                std::cerr << "   labeling of incoming inter-frame edges is moral" << std::endl;
        }

        // test cycle constraints of inter-frame edges
        if (frame != 0)
        {
            SubgraphCutTwoFrames subgraph(problem, solution.edge_labels, frame - 1);

            bool cycleConstraintsSatisfied = true;
            for (size_t j = 0; j < problemGraph.numberOfEdgesFromFrame(frame - 1); ++j)
            {
                auto e = problemGraph.edgeFromFrame(frame - 1, j);

                if (solution.edge_labels[e] == 1) // cut
                {
                    auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
                    auto v1 = problemGraph.graph().vertexOfEdge(e, 1);
                    
                    std::deque<std::size_t> path;
                    if (andres::graph::spsp(problemGraph.graph(), subgraph, v0, v1, path) == true)
                    {
                        cycleConstraintsSatisfied = false;

                        std::cerr << "   error: the inter-frame edge " << e
                            << " between nodes " << v0
                            << " (t=" << problemGraph.problem().nodes[v0].t
                            << ", cx=" << problemGraph.problem().nodes[v0].cx
                            << ", cy=" << problemGraph.problem().nodes[v0].cy
                            << ", frame component=" << componentsPerFrame.labels_[v0]
                            << ") and " << v1
                            << " (t=" << problemGraph.problem().nodes[v1].t
                            << ", cx=" << problemGraph.problem().nodes[v1].cx
                            << ", cy=" << problemGraph.problem().nodes[v1].cy
                            << ", frame component=" << componentsPerFrame.labels_[v1]
                            << ") is part of a violated inter-frame cycle constraint."
                            << std::endl;
                    }
                }
            }

            if (cycleConstraintsSatisfied)
                std::cerr << "   labeling of incoming inter-frame edges satisfies cycle constraints" << std::endl;
        }
    }
}